

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddMisc.c
# Opt level: O2

void Cudd_zddPrintSubtable(DdManager *table)

{
  DdNode *pDVar1;
  DdSubtable *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  uint uVar5;
  DdNode **ppDVar6;
  uint uVar7;
  
  pDVar1 = table->one;
  uVar5 = table->sizeZ;
  while (0 < (int)uVar5) {
    uVar5 = uVar5 - 1;
    pDVar2 = table->subtableZ;
    printf("subtable[%d]:\n");
    uVar7 = pDVar2[uVar5].slots;
    while (uVar7 = uVar7 - 1, -1 < (int)uVar7) {
      ppDVar6 = pDVar2[uVar5].nodelist + (uVar7 & 0x7fffffff);
      while (pDVar3 = *ppDVar6, pDVar3 != (DdNode *)0x0) {
        fprintf((FILE *)table->out,"ID = 0x%lx\tindex = %u\tr = %u\t",(ulong)pDVar3 / 0x28,
                (ulong)pDVar3->index,(ulong)pDVar3->ref);
        pDVar4 = (pDVar3->type).kids.T;
        if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
          fprintf((FILE *)table->out,"T = %d\t\t",(ulong)(pDVar4 == pDVar1));
        }
        else {
          fprintf((FILE *)table->out,"T = 0x%lx\t",(ulong)pDVar4 / 0x28);
        }
        pDVar4 = (pDVar3->type).kids.E;
        if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
          fprintf((FILE *)table->out,"E = %d\n",(ulong)(pDVar4 == pDVar1));
        }
        else {
          fprintf((FILE *)table->out,"E = 0x%lx\n",(ulong)pDVar4 / 0x28);
        }
        ppDVar6 = &pDVar3->next;
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

void
Cudd_zddPrintSubtable(
  DdManager * table)
{
    int         i, j;
    DdNode      *z1, *z1_next, *base;
    DdSubtable  *ZSubTable;

    base = table->one;
    for (i = table->sizeZ - 1; i >= 0; i--) {
        ZSubTable = &(table->subtableZ[i]);
        printf("subtable[%d]:\n", i);
        for (j = ZSubTable->slots - 1; j >= 0; j--) {
            z1 = ZSubTable->nodelist[j];
            while (z1 != NIL(DdNode)) {
                (void) fprintf(table->out,
#if SIZEOF_VOID_P == 8
                    "ID = 0x%lx\tindex = %u\tr = %u\t",
                    (ptruint) z1 / (ptruint) sizeof(DdNode),
                    z1->index, z1->ref);
#else
                    "ID = 0x%x\tindex = %hu\tr = %hu\t",
                    (ptruint) z1 / (ptruint) sizeof(DdNode),
                    z1->index, z1->ref);
#endif
                z1_next = cuddT(z1);
                if (Cudd_IsConstant(z1_next)) {
                    (void) fprintf(table->out, "T = %d\t\t",
                        (z1_next == base));
                }
                else {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out, "T = 0x%lx\t",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#else
                    (void) fprintf(table->out, "T = 0x%x\t",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#endif
                }
                z1_next = cuddE(z1);
                if (Cudd_IsConstant(z1_next)) {
                    (void) fprintf(table->out, "E = %d\n",
                        (z1_next == base));
                }
                else {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out, "E = 0x%lx\n",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#else
                    (void) fprintf(table->out, "E = 0x%x\n",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#endif
                }

                z1_next = z1->next;
                z1 = z1_next;
            }
        }
    }
    putchar('\n');

}